

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O2

JavascriptMethod NativeCodeGenerator::CheckAsmJsCodeGen(ScriptFunction *function)

{
  NativeCodeGenerator *manager;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *this;
  ScriptContext *pSVar6;
  ThreadContext *pTVar7;
  FunctionEntryPointInfo *holder;
  JobProcessor *pJVar8;
  FunctionBody *pFVar9;
  undefined4 extraout_var;
  JavascriptMethod p_Var10;
  undefined4 extraout_var_00;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x628,"(function)","function");
    if (!bVar2) goto LAB_0058eb03;
    *puVar5 = 0;
  }
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  pSVar6 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  manager = pSVar6->nativeCodeGen;
  pTVar7 = pSVar6->threadContext;
  if (pTVar7->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x62d,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) goto LAB_0058eb03;
    *puVar5 = 0;
    pTVar7 = pSVar6->threadContext;
  }
  if (pTVar7->callRootLevel == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x62e,"(scriptContext->GetThreadContext()->IsInScript())",
                       "scriptContext->GetThreadContext()->IsInScript()");
    if (!bVar2) goto LAB_0058eb03;
    *puVar5 = 0;
  }
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0) {
    uVar3 = Js::FunctionBody::GetByteCodeCount(this);
    if (uVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x630,
                         "(!functionBody->IsWasmFunction() || functionBody->GetByteCodeCount() > 0)"
                         ,"Wasm function should be parsed by now");
      if (!bVar2) {
LAB_0058eb03:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  holder = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmJsJITTemplatePhase);
  if ((!bVar2) || (DAT_01441e20 < 0)) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmJsJITTemplatePhase);
    if ((bVar2) || (DAT_01441e28 < 0)) {
      pJVar8 = JsUtil::JobManager::Processor((JobManager *)manager);
      bVar2 = JsUtil::JobProcessor::PrioritizeJob<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
                        (pJVar8,manager,holder,function);
      if (!bVar2) {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsEntryPointInfoPhase);
        if (bVar2) {
          pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
          iVar4 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(pFVar9);
          Output::Print(L"Codegen not done yet for function: %s, Entrypoint is CheckAsmJsCodeGenThunk\n"
                        ,CONCAT44(extraout_var_00,iVar4));
        }
        p_Var10 = Js::FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)this);
        return p_Var10;
      }
      goto LAB_0058ea38;
    }
  }
  pJVar8 = JsUtil::JobManager::Processor((JobManager *)manager);
  JsUtil::JobProcessor::PrioritizeJobAndWait<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
            (pJVar8,manager,holder,function);
LAB_0058ea38:
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsEntryPointInfoPhase);
  if (bVar2) {
    pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    iVar4 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
    Output::Print(L"CodeGen Done for function: %s, Changing Entrypoint to Full JIT\n",
                  CONCAT44(extraout_var,iVar4));
  }
  p_Var10 = CheckCodeGenDone(this,holder,function);
  return p_Var10;
}

Assistant:

Js::JavascriptMethod
NativeCodeGenerator::CheckAsmJsCodeGen(Js::ScriptFunction * function)
{
    Assert(function);
    Js::FunctionBody *functionBody = function->GetFunctionBody();
    Js::ScriptContext *scriptContext = functionBody->GetScriptContext();

    NativeCodeGenerator *nativeCodeGen = scriptContext->GetNativeCodeGenerator();
    Assert(scriptContext->GetThreadContext()->IsScriptActive());
    Assert(scriptContext->GetThreadContext()->IsInScript());

    AssertOrFailFastMsg(!functionBody->IsWasmFunction() || functionBody->GetByteCodeCount() > 0, "Wasm function should be parsed by now");
    // Load the entry point here to validate it got changed afterwards

    Js::FunctionEntryPointInfo* entryPoint = function->GetFunctionEntryPointInfo();

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if ((PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) >= 0) || (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxAsmJsInterpreterRunCount) >= 0))
    {
        nativeCodeGen->Processor()->PrioritizeJobAndWait(nativeCodeGen, entryPoint, function);
    } else
#endif
    if (!nativeCodeGen->Processor()->PrioritizeJob(nativeCodeGen, entryPoint, function))
    {
        if (PHASE_TRACE1(Js::AsmjsEntryPointInfoPhase))
        {
            Output::Print(_u("Codegen not done yet for function: %s, Entrypoint is CheckAsmJsCodeGenThunk\n"), function->GetFunctionBody()->GetDisplayName());
        }
        return functionBody->GetOriginalEntryPoint();
    }
    if (PHASE_TRACE1(Js::AsmjsEntryPointInfoPhase))
    {
        Output::Print(_u("CodeGen Done for function: %s, Changing Entrypoint to Full JIT\n"), function->GetFunctionBody()->GetDisplayName());
    }
    // we will need to set the functionbody external and asmjs entrypoint to the fulljit entrypoint
    return CheckCodeGenDone(functionBody, entryPoint, function);
}